

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Communicator.hpp
# Opt level: O2

void __thiscall
OpenMD::Communicator<(OpenMD::communicatorType)2>::Communicator
          (Communicator<(OpenMD::communicatorType)2> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  int myRank;
  int nProc;
  
  MPI_Comm_size(&ompi_mpi_comm_world,&nProc);
  MPI_Comm_rank(&ompi_mpi_comm_world);
  dVar4 = (double)nProc;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  iVar2 = (int)dVar4;
  iVar1 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (iVar3 = 1; iVar3 - iVar2 != 1; iVar3 = iVar3 + 1) {
    if (nProc % iVar3 == 0) {
      iVar1 = iVar3;
    }
  }
  this->rowIndex_ = myRank / iVar1;
  this->columnIndex_ = (int)((long)myRank % (long)iVar1);
  MPI_Comm_split(&ompi_mpi_comm_world,(long)myRank % (long)iVar1 & 0xffffffff,0,&this->myComm);
  return;
}

Assistant:

Communicator<D>() {
      int nProc;
      int myRank;

      MPI_Comm_size(MPI_COMM_WORLD, &nProc);
      MPI_Comm_rank(MPI_COMM_WORLD, &myRank);

      int nColumnsMax = (int)sqrt(RealType(nProc));

      int nColumns(0);
      for (int i = 1; i < nColumnsMax + 1; i++) {
        if (nProc % i == 0) nColumns = i;
      }

      // int nRows = nProc / nColumns;
      rowIndex_    = myRank / nColumns;
      columnIndex_ = myRank % nColumns;

      switch (D) {
      case Row:
        MPI_Comm_split(MPI_COMM_WORLD, rowIndex_, 0, &myComm);
        break;
      case Column:
        MPI_Comm_split(MPI_COMM_WORLD, columnIndex_, 0, &myComm);
        break;
      case Global:
        MPI_Comm_split(MPI_COMM_WORLD, myRank, 0, &myComm);
      }
    }